

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestConflictingMethodNames::CallMethod
          (TestConflictingMethodNames *this,MethodDescriptor *method,RpcController *controller,
          Message *request,Message *response,Closure *done)

{
  Nullable<const_char_*> failure_msg;
  DummyMessage *pDVar1;
  DummyMessage *pDVar2;
  LogMessage local_40;
  
  local_40._0_8_ = method->service_;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::ServiceDescriptor_const*,google::protobuf::ServiceDescriptor_const*>
                          ((ServiceDescriptor **)&local_40,
                           file_level_service_descriptors_google_2fprotobuf_2fcompiler_2fcpp_2ftest_5fbad_5fidentifiers_5fproto2_2eproto
                           ,
                           "method->service() == file_level_service_descriptors_google_2fprotobuf_2fcompiler_2fcpp_2ftest_5fbad_5fidentifiers_5fproto2_2eproto[0]"
                          );
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
               ,0x239e,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  if ((int)(((long)method - (long)method->service_->methods_) / 0x50) == 0) {
    pDVar1 = google::protobuf::DownCastMessage<proto2_unittest::DummyMessage>
                       (&request->super_MessageLite);
    pDVar2 = google::protobuf::DownCastMessage<proto2_unittest::DummyMessage>
                       (&response->super_MessageLite);
    (*(this->super_Service)._vptr_Service[6])(this,controller,pDVar1,pDVar2,done);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
             ,0x23a6);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&local_40,(char (*) [44])"Bad method index; this should never happen.");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void TestConflictingMethodNames::CallMethod(
    const ::google::protobuf::MethodDescriptor* PROTOBUF_NONNULL method,
    ::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
    const ::google::protobuf::Message* PROTOBUF_NONNULL request,
    ::google::protobuf::Message* PROTOBUF_NONNULL response, ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  ABSL_DCHECK_EQ(method->service(), file_level_service_descriptors_google_2fprotobuf_2fcompiler_2fcpp_2ftest_5fbad_5fidentifiers_5fproto2_2eproto[0]);
  switch (method->index()) {
    case 0:
      this->Closure(controller, ::google::protobuf::DownCastMessage<::proto2_unittest::DummyMessage>(request),
                   ::google::protobuf::DownCastMessage<::proto2_unittest::DummyMessage>(response), done);
      break;

    default:
      ABSL_LOG(FATAL) << "Bad method index; this should never happen.";
      break;
  }
}